

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sha1.cpp
# Opt level: O3

void __thiscall
ON_SHA1::Internal_SwapBigEndianUpdate(ON_SHA1 *this,void *buffer,ON__UINT64 sizeof_buffer)

{
  endian eVar1;
  ON__UINT64 sizeof_buffer_00;
  long lVar2;
  uchar reversed_buffer [32];
  undefined1 local_48 [32];
  
  eVar1 = ON::Endian();
  if (((sizeof_buffer != 0) && (buffer != (void *)0x0)) && (eVar1 == big_endian)) {
    if (0 < (long)sizeof_buffer) {
      sizeof_buffer_00 = 0;
      for (lVar2 = sizeof_buffer - 1;
          local_48[sizeof_buffer_00] = *(undefined1 *)((long)buffer + lVar2), lVar2 != 0;
          lVar2 = lVar2 + -1) {
        sizeof_buffer_00 = sizeof_buffer_00 + 1;
        if (sizeof_buffer_00 == 0x20) {
          AccumulateBytes(this,local_48,0x20);
          if ((void *)((long)buffer + lVar2) <= buffer) {
            return;
          }
          sizeof_buffer_00 = 0;
        }
      }
      AccumulateBytes(this,local_48,sizeof_buffer_00);
    }
    return;
  }
  AccumulateBytes(this,buffer,sizeof_buffer);
  return;
}

Assistant:

void ON_SHA1::Internal_SwapBigEndianUpdate(
  const void* buffer,
  ON__UINT64 sizeof_buffer
)
{
  if (ON::Endian() == ON::endian::big_endian && nullptr != buffer && sizeof_buffer > 0)
  {
    unsigned char reversed_buffer[32];
    const ON__UINT64 reversed_buffer_capacity = (ON__UINT64)sizeof(reversed_buffer);
    ON__UINT64 sizeof_reversed_buffer;
    const char* p0 = (const char*)buffer;
    const char* p1 = p0 + sizeof_buffer;
    while (p0 < p1)
    {
      for (sizeof_reversed_buffer = 0; sizeof_reversed_buffer < reversed_buffer_capacity; sizeof_reversed_buffer++)
      {
        reversed_buffer[sizeof_reversed_buffer] = *--p1;
        if (p0 == p1)
          break;
      }
      AccumulateBytes( reversed_buffer, sizeof_reversed_buffer );
    }
  }
  else
  {
    AccumulateBytes(buffer, sizeof_buffer);
  }
}